

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O2

void Ssw_ManRefineByFilterSim(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  
  if (0 < nFrames) {
    for (iVar6 = 0; pAVar7 = p->pAig, iVar6 < pAVar7->nRegs; iVar6 = iVar6 + 1) {
      pvVar2 = Vec_PtrEntry(pAVar7->vCos,pAVar7->nTruePos + iVar6);
      iVar5 = p->pAig->nTruePis + iVar6;
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar5 >> 5] >> ((byte)iVar5 & 0x1f) & 1) << 5);
    }
    for (iVar6 = 0; iVar6 != nFrames; iVar6 = iVar6 + 1) {
      puVar1 = &p->pAig->pConst1->field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
      for (iVar5 = 0; pAVar7 = p->pAig, iVar5 < pAVar7->nTruePis; iVar5 = iVar5 + 1) {
        pvVar2 = Vec_PtrEntry(pAVar7->vCis,iVar5);
        *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) & 0xdf;
      }
      for (iVar5 = 0; iVar5 < pAVar7->nRegs; iVar5 = iVar5 + 1) {
        pAVar3 = Saig_ManLi(pAVar7,iVar5);
        pAVar4 = Saig_ManLo(p->pAig,iVar5);
        *(ulong *)&pAVar4->field_0x18 =
             *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)&pAVar3->field_0x18 & 0x20);
        pAVar7 = p->pAig;
      }
      for (iVar5 = 0; iVar5 < pAVar7->vObjs->nSize; iVar5 = iVar5 + 1) {
        pvVar2 = Vec_PtrEntry(pAVar7->vObjs,iVar5);
        if ((pvVar2 != (void *)0x0) &&
           (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                        *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >>
                        5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                             *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)
                             >> 5) & 1) << 5);
        }
        pAVar7 = p->pAig;
      }
      for (iVar5 = 0; iVar5 < pAVar7->vCos->nSize; iVar5 = iVar5 + 1) {
        pvVar2 = Vec_PtrEntry(pAVar7->vCos,iVar5);
        *(ulong *)((long)pvVar2 + 0x18) =
             *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        pAVar7 = p->pAig;
      }
      if (iVar6 == 0) {
        for (iVar5 = 0; iVar5 < pAVar7->vObjs->nSize; iVar5 = iVar5 + 1) {
          pvVar2 = Vec_PtrEntry(pAVar7->vObjs,iVar5);
          if (pvVar2 != (void *)0x0) {
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7 |
                 (ulong)((uint)(*(ulong *)((long)pvVar2 + 0x18) >> 2) & 8);
          }
          pAVar7 = p->pAig;
        }
      }
      else {
        Ssw_ClassesRefineConst1(p->ppClasses,0);
        Ssw_ClassesRefine(p->ppClasses,0);
      }
    }
    return;
  }
  __assert_fail("nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswFilter.c"
                ,0x32,"void Ssw_ManRefineByFilterSim(Ssw_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs fraiging for one node.]

  Description [Returns the fraiged node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManRefineByFilterSim( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, RetValue1, RetValue2;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
}